

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraLcr.c
# Opt level: O2

void Lcr_ManFree(Fra_Lcr_t *p)

{
  Vec_Ptr_t *p_00;
  undefined8 *puVar1;
  int i;
  
  if (p->fVerbose != 0) {
    Lcr_ManPrint(p);
  }
  for (i = 0; p_00 = p->pAig->vCis, i < p_00->nSize; i = i + 1) {
    puVar1 = (undefined8 *)Vec_PtrEntry(p_00,i);
    *puVar1 = 0;
  }
  Vec_PtrFree(p->vFraigs);
  if (p->pCla != (Fra_Cla_t *)0x0) {
    Fra_ClassesStop(p->pCla);
  }
  if ((Vec_Vec_t *)p->vParts != (Vec_Vec_t *)0x0) {
    Vec_VecFree((Vec_Vec_t *)p->vParts);
  }
  if (p->pInToOutPart != (int *)0x0) {
    free(p->pInToOutPart);
    p->pInToOutPart = (int *)0x0;
  }
  free(p->pInToOutNum);
  free(p);
  return;
}

Assistant:

void Lcr_ManFree( Fra_Lcr_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    if ( p->fVerbose )
        Lcr_ManPrint( p );
    Aig_ManForEachCi( p->pAig, pObj, i )
        pObj->pNext = NULL;
    Vec_PtrFree( p->vFraigs );
    if ( p->pCla  )     Fra_ClassesStop( p->pCla );
    if ( p->vParts  )   Vec_VecFree( (Vec_Vec_t *)p->vParts );
    ABC_FREE( p->pInToOutPart );
    ABC_FREE( p->pInToOutNum );
    ABC_FREE( p );
}